

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall GlobOpt::CollectMemsetStElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  Opnd *this_00;
  BasicBlock *block;
  IntConstType value;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  IndirOpnd *pIVar6;
  GlobOpt *pGVar7;
  StackSym *pSVar8;
  RegOpnd *src;
  Value *srcVal;
  FloatConstOpnd *pFVar9;
  IntConstOpnd *pIVar10;
  AddrOpnd *pAVar11;
  StackSym *pSVar12;
  JITTimeFunctionBody *this_01;
  char16 *pcVar13;
  char16 *pcVar14;
  GlobOpt *this_02;
  MemOpCandidate *local_c8;
  char16 debugStringBuffer [42];
  undefined1 auStack_58 [8];
  BailoutConstantValue constant;
  SymID local_40;
  SymID local_3c;
  SymID inductionSymID;
  
  _inductionSymID = this;
  bVar2 = IR::Opnd::IsIndirOpnd(instr->m_dst);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x7d5,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar2) goto LAB_00422fff;
    *puVar5 = 0;
  }
  pIVar6 = IR::Opnd::AsIndirOpnd(instr->m_dst);
  this_02 = (GlobOpt *)pIVar6->m_indexOpnd;
  pGVar7 = (GlobOpt *)IR::Opnd::AsRegOpnd(&pIVar6->m_baseOpnd->super_Opnd);
  bVar2 = IsAllowedForMemOpt(_inductionSymID,instr,false,(RegOpnd *)pGVar7,(Opnd *)this_02);
  if (!bVar2) {
    return false;
  }
  pSVar8 = IR::Opnd::GetStackSym((Opnd *)pGVar7);
  local_3c = GetVarSymID(pGVar7,pSVar8);
  this_00 = instr->m_src1;
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if (bVar2) {
    src = IR::Opnd::AsRegOpnd(this_00);
    pGVar7 = _inductionSymID;
    block = _inductionSymID->currentBlock;
    srcVal = GlobOptBlockData::FindValue(&block->globOptData,&src->m_sym->super_Sym);
    bVar2 = OptIsInvariant(pGVar7,&src->super_Opnd,block,loop,srcVal,true,true);
    if (!bVar2) goto LAB_00422cb8;
    pSVar8 = IR::Opnd::GetStackSym(&src->super_Opnd);
  }
  else {
LAB_00422cb8:
    pSVar8 = (StackSym *)0x0;
  }
  auStack_58 = (undefined1  [8])0x0;
  constant.type = TyIllegal;
  constant._1_7_ = 0;
  bVar2 = IR::Opnd::IsFloatConstOpnd(this_00);
  if (bVar2) {
    pFVar9 = IR::Opnd::AsFloatConstOpnd(this_00);
    constant._0_8_ = pFVar9->m_value;
    auStack_58[0] = TyFloat64;
  }
  else {
    bVar2 = IR::Opnd::IsIntConstOpnd(this_00);
    if (bVar2) {
      pIVar10 = IR::Opnd::AsIntConstOpnd(this_00);
      value = (pIVar10->super_EncodableOpnd<long>).m_value;
      pIVar10 = IR::Opnd::AsIntConstOpnd(this_00);
      BailoutConstantValue::InitIntConstValue
                ((BailoutConstantValue *)auStack_58,value,(pIVar10->super_Opnd).m_type);
    }
    else {
      bVar2 = IR::Opnd::IsAddrOpnd(this_00);
      pGVar7 = _inductionSymID;
      if (bVar2) {
        pAVar11 = IR::Opnd::AsAddrOpnd(this_00);
        BailoutConstantValue::InitVarConstValue
                  ((BailoutConstantValue *)auStack_58,pAVar11->m_address);
      }
      else if (pSVar8 == (StackSym *)0x0) {
        if (DAT_0145948a != '\x01') {
          return false;
        }
        uVar3 = Func::GetSourceContextId(_inductionSymID->func);
        uVar4 = Func::GetLocalFunctionId(pGVar7->func);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar3,uVar4);
        if (!bVar2) {
          uVar3 = Func::GetSourceContextId(pGVar7->func);
          uVar4 = Func::GetLocalFunctionId(pGVar7->func);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar3,uVar4);
          if (!bVar2) {
            return false;
          }
        }
        Output::Print(L"TRACE MemSet:");
        this_01 = Func::GetJITFunctionBody(pGVar7->func);
        pcVar13 = JITTimeFunctionBody::GetDisplayName(this_01);
        pcVar14 = Func::GetDebugNumberSet(pGVar7->func,(wchar (*) [42])&local_c8);
        uVar3 = Loop::GetLoopNumber(loop);
        Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar3);
        Output::Print(L"Source is not an invariant");
        IR::Instr::DumpByteCodeOffset(instr);
        pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
        Output::Print(L" (%s)",pcVar13);
        Output::Print(L"\n");
        Output::Flush();
        return false;
      }
    }
  }
  pSVar12 = IR::Opnd::GetStackSym((Opnd *)this_02);
  pGVar7 = _inductionSymID;
  if (pSVar12 == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x800,"(indexOp->GetStackSym())","indexOp->GetStackSym()");
    if (!bVar2) goto LAB_00422fff;
    *puVar5 = 0;
  }
  pSVar12 = IR::Opnd::GetStackSym((Opnd *)this_02);
  local_40 = GetVarSymID(this_02,pSVar12);
  bVar2 = IsSymIDInductionVariable(this_02,local_40,loop);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x802,"(IsSymIDInductionVariable(inductionSymID, loop))",
                       "IsSymIDInductionVariable(inductionSymID, loop)");
    if (!bVar2) {
LAB_00422fff:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  Loop::EnsureMemOpVariablesInitialized(loop);
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,&local_40);
  local_c8 = (MemOpCandidate *)
             new<Memory::JitArenaAllocator>(0x28,pGVar7->func->topFunc->m_fg->alloc,0x3d6ef4);
  local_c8->type = MEMSET;
  local_c8->base = local_3c;
  local_c8->index = local_40;
  local_c8[1].base = auStack_58._0_4_;
  local_c8[1].index = auStack_58._4_4_;
  local_c8[1].count = constant.type;
  local_c8[1].bIndexAlreadyChanged = (bool)constant._1_1_;
  *(undefined2 *)&local_c8[1].field_0xa = constant._2_2_;
  local_c8[1].type = constant._4_4_;
  *(StackSym **)(local_c8 + 2) = pSVar8;
  local_c8->count = '\x01';
  local_c8->bIndexAlreadyChanged = bVar2;
  SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&loop->memOpInfo->candidates->
              super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>,&local_c8);
  return true;
}

Assistant:

bool
GlobOpt::CollectMemsetStElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();
    IR::Opnd *indexOp = dst->GetIndexOpnd();
    IR::RegOpnd *baseOp = dst->GetBaseOpnd()->AsRegOpnd();

    if (!IsAllowedForMemOpt(instr, true, baseOp, indexOp))
    {
        return false;
    }

    SymID baseSymID = GetVarSymID(baseOp->GetStackSym());

    IR::Opnd *srcDef = instr->GetSrc1();
    StackSym *srcSym = nullptr;
    if (srcDef->IsRegOpnd())
    {
        IR::RegOpnd* opnd = srcDef->AsRegOpnd();
        if (this->OptIsInvariant(opnd, this->currentBlock, loop, CurrentBlockData()->FindValue(opnd->m_sym), true, true))
        {
            srcSym = opnd->GetStackSym();
        }
    }

    BailoutConstantValue constant = {TyIllegal, 0};
    if (srcDef->IsFloatConstOpnd())
    {
        constant.InitFloatConstValue(srcDef->AsFloatConstOpnd()->m_value);
    }
    else if (srcDef->IsIntConstOpnd())
    {
        constant.InitIntConstValue(srcDef->AsIntConstOpnd()->GetValue(), srcDef->AsIntConstOpnd()->GetType());
    }
    else if (srcDef->IsAddrOpnd())
    {
        constant.InitVarConstValue(srcDef->AsAddrOpnd()->m_address);
    }
    else if(!srcSym)
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Source is not an invariant"));
        return false;
    }

    // Process the Index Operand
    Assert(indexOp->GetStackSym());
    SymID inductionSymID = GetVarSymID(indexOp->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));

    loop->EnsureMemOpVariablesInitialized();
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);

    Loop::MemSetCandidate* memsetInfo = JitAnewStruct(this->func->GetTopFunc()->m_fg->alloc, Loop::MemSetCandidate);
    memsetInfo->base = baseSymID;
    memsetInfo->index = inductionSymID;
    memsetInfo->constant = constant;
    memsetInfo->srcSym = srcSym;
    memsetInfo->count = 1;
    memsetInfo->bIndexAlreadyChanged = isIndexPreIncr;
    loop->memOpInfo->candidates->Prepend(memsetInfo);
    return true;
}